

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void __thiscall
duckdb::RLECompressState<duckdb::hugeint_t,_true>::WriteValue
          (RLECompressState<duckdb::hugeint_t,_true> *this,hugeint_t value,rle_count_t count,
          bool is_null)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  undefined8 *puVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t iVar5;
  __int_type _Var6;
  undefined8 uVar7;
  pointer pCVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  undefined7 in_register_00000081;
  ulong *puVar13;
  ulong local_38;
  long lStack_30;
  
  lVar10 = value.upper;
  uVar11 = value.lower;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  pdVar3 = ((this->handle).node.ptr)->buffer;
  iVar4 = this->max_rle_count;
  lVar9 = this->entry_count * 0x10;
  *(ulong *)(pdVar3 + lVar9 + 8) = uVar11;
  *(long *)(pdVar3 + lVar9 + 0x10) = lVar10;
  iVar5 = this->entry_count;
  *(rle_count_t *)(pdVar3 + iVar5 * 2 + iVar4 * 0x10 + 8) = count;
  this->entry_count = iVar5 + 1;
  if ((int)CONCAT71(in_register_00000081,is_null) == 0) {
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    puVar2 = (undefined8 *)((long)&(pCVar8->stats).statistics.stats_union + 0x18);
    local_38 = uVar11;
    lStack_30 = lVar10;
    lVar9 = *(long *)((long)&(pCVar8->stats).statistics.stats_union + 0x20);
    puVar12 = puVar2;
    if (lVar9 == lVar10) {
      puVar12 = &local_38;
    }
    if (uVar11 <= *(ulong *)((long)&(pCVar8->stats).statistics.stats_union + 0x18)) {
      puVar12 = puVar2;
    }
    if (lVar9 < lVar10) {
      puVar12 = &local_38;
    }
    lVar9 = *(long *)((long)&(pCVar8->stats).statistics.stats_union + 0x10);
    puVar2 = (undefined8 *)((long)&(pCVar8->stats).statistics.stats_union + 8);
    puVar13 = puVar2;
    if (lVar9 == lVar10) {
      puVar13 = &local_38;
    }
    if (*(ulong *)((long)&(pCVar8->stats).statistics.stats_union + 8) <= uVar11) {
      puVar13 = puVar2;
    }
    if (lVar10 < lVar9) {
      puVar13 = &local_38;
    }
    uVar7 = puVar13[1];
    *(ulong *)((long)&(pCVar8->stats).statistics.stats_union + 8) = *puVar13;
    *(undefined8 *)((long)&(pCVar8->stats).statistics.stats_union + 0x10) = uVar7;
    uVar7 = puVar12[1];
    *(ulong *)((long)&(pCVar8->stats).statistics.stats_union + 0x18) = *puVar12;
    *(undefined8 *)((long)&(pCVar8->stats).statistics.stats_union + 0x20) = uVar7;
  }
  this_00 = &this->current_segment;
  pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + (ulong)count;
  UNLOCK();
  if (this->entry_count == this->max_rle_count) {
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    iVar4 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar8 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    _Var6 = (pCVar8->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var6 + iVar4);
    this->entry_count = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}